

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[50],char[11],unsigned_int,char[2],unsigned_int,char[62],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[28],unsigned_int,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [50],char (*Args_1) [11],
          uint *Args_2,char (*Args_3) [2],uint *Args_4,char (*Args_5) [62],char **Args_6,
          char (*Args_7) [8],uint *Args_8,char (*Args_9) [9],uint *Args_10,char (*Args_11) [28],
          uint *Args_12,char (*Args_13) [2],uint *Args_14,char (*Args_15) [44],char **Args_16,
          char (*Args_17) [8],uint *Args_18,char (*Args_19) [9],uint *Args_20,char (*Args_21) [3])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[50],char[11],unsigned_int,char[2],unsigned_int,char[62],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[28],unsigned_int,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [50])this,(char (*) [11])Args,(uint *)Args_1,(char (*) [2])Args_2,
             (uint *)Args_3,(char (*) [62])Args_4,(char **)Args_5,(char (*) [8])Args_6,
             (uint *)Args_7,(char (*) [9])Args_8,(uint *)Args_9,(char (*) [28])Args_10,
             (uint *)Args_11,(char (*) [2])Args_12,(uint *)Args_13,(char (*) [44])Args_14,
             (char **)Args_15,(char (*) [8])Args_16,(uint *)Args_17,(char (*) [9])Args_18,
             (uint *)Args_19,(char (*) [3])Args_20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}